

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

basic_substring<char> __thiscall
c4::basic_substring<char>::triml(basic_substring<char> *this,ro_substr chars)

{
  ro_substr chars_00;
  basic_substring<char> bVar1;
  error_flags eVar2;
  size_t sVar3;
  size_t in_RSI;
  basic_substring<char> *in_RDI;
  bool bVar4;
  size_t pos;
  size_t rnum;
  undefined5 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef5;
  undefined1 in_stack_fffffffffffffef6;
  undefined1 in_stack_fffffffffffffef7;
  char *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  undefined1 in_stack_ffffffffffffff07;
  uint7 in_stack_ffffffffffffff20;
  char *local_a8;
  size_t local_a0;
  char *local_78;
  size_t local_70;
  char *local_18;
  size_t local_10;
  
  bVar4 = true;
  if (in_RDI->len != 0) {
    bVar4 = in_RDI->str == (char *)0x0;
  }
  if ((bVar4) ||
     (chars_00.len = in_RSI, chars_00.str = (char *)(ulong)in_stack_ffffffffffffff20,
     sVar3 = first_not_of(in_RDI,chars_00,(size_t)in_RDI), sVar3 == 0xffffffffffffffff)) {
    basic_substring((basic_substring<char> *)
                    CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),(char *)in_RDI,
                    CONCAT17(in_stack_fffffffffffffef7,
                             CONCAT16(1,CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0
                                                ))));
    local_a8 = local_18;
    local_a0 = local_10;
  }
  else {
    if (in_RDI->len < sVar3) {
      eVar2 = get_error_flags();
      if (((eVar2 & 1) != 0) &&
         (in_stack_ffffffffffffff07 = is_debugger_attached(), (bool)in_stack_ffffffffffffff07)) {
        trap_instruction();
      }
      handle_error(0x389522,(char *)0x1533,"check failed: %s","first >= 0 && first <= len");
    }
    basic_substring((basic_substring<char> *)
                    CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                    in_stack_fffffffffffffef8,
                    CONCAT17(in_stack_fffffffffffffef7,
                             CONCAT16(in_stack_fffffffffffffef6,
                                      CONCAT15(in_stack_fffffffffffffef5,in_stack_fffffffffffffef0))
                            ));
    local_a8 = local_78;
    local_a0 = local_70;
  }
  bVar1.len = local_a0;
  bVar1.str = local_a8;
  return bVar1;
}

Assistant:

basic_substring triml(ro_substr chars) const
    {
        if( ! empty())
        {
            size_t pos = first_not_of(chars);
            if(pos != npos)
                return sub(pos);
        }
        return sub(0, 0);
    }